

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  byte *pbVar3;
  byte bVar4;
  BYTE BVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  U32 length;
  uint uVar9;
  BYTE *pBVar10;
  ushort *puVar11;
  long lVar12;
  ushort *puVar13;
  ushort *puVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  uint uVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  ulong uVar20;
  int iVar21;
  BYTE *s;
  ushort *puVar22;
  ushort *__src;
  ulong uVar23;
  BYTE *d;
  ulong uVar24;
  BYTE *dstEnd;
  
  iVar21 = -1;
  if (source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        iVar21 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pBVar2 = (BYTE *)(dest + maxDecompressedSize);
      puVar13 = (ushort *)source;
      dstEnd = (BYTE *)dest;
      if (maxDecompressedSize < 0x40) goto LAB_00111e59;
LAB_00111bbe:
      __src = (ushort *)((long)puVar13 + 1);
      bVar4 = (byte)*puVar13;
      uVar23 = (ulong)(uint)(bVar4 >> 4);
      if (bVar4 >> 4 == 0xf) {
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00111dd8;
        puVar14 = puVar13 + 1;
        uVar17 = 0;
        puVar13 = puVar13 + 8;
        do {
          puVar22 = __src;
          puVar11 = puVar13;
          __src = (ushort *)((long)puVar22 + 1);
          uVar17 = uVar17 + *(byte *)((long)puVar11 + -0xf);
          puVar14 = (ushort *)((long)puVar14 + 1);
          puVar13 = (ushort *)((long)puVar11 + 1);
        } while (puVar11 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                 *(byte *)((long)puVar11 + -0xf) == 0xff);
        uVar23 = (ulong)uVar17 + 0xf;
        pBVar18 = dstEnd + uVar23;
        if ((CARRY8((ulong)dstEnd,uVar23)) || ((ulong)-(long)puVar14 < uVar23)) {
          __src = puVar11 + -7;
          goto LAB_00111dd8;
        }
        uVar9 = (uint)bVar4;
        if (dest + (long)maxDecompressedSize + -0x20 < pBVar18) goto LAB_00111ecf;
        puVar13 = (ushort *)((ulong)uVar17 + (long)puVar11 + 1);
        if (puVar1 + -0x10 < puVar13) {
          __src = puVar11 + -7;
          uVar9 = (uint)bVar4;
          goto LAB_00111ecf;
        }
        lVar12 = 0;
        do {
          uVar7 = *(undefined8 *)((byte *)((long)__src + lVar12) + 8);
          pBVar15 = dstEnd + lVar12;
          *(undefined8 *)pBVar15 = *(undefined8 *)((long)__src + lVar12);
          *(undefined8 *)(pBVar15 + 8) = uVar7;
          pbVar3 = (byte *)((long)puVar22 + lVar12 + 0x11);
          uVar7 = *(undefined8 *)(pbVar3 + 8);
          *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)pbVar3;
          *(undefined8 *)(pBVar15 + 0x18) = uVar7;
          lVar12 = lVar12 + 0x20;
        } while (pBVar15 + 0x20 < pBVar18);
      }
      else {
        pBVar18 = dstEnd + uVar23;
        uVar9 = (uint)bVar4;
        if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_00111ecf;
        uVar7 = *(undefined8 *)((long)puVar13 + 9);
        *(undefined8 *)dstEnd = *(undefined8 *)__src;
        *(undefined8 *)(dstEnd + 8) = uVar7;
        puVar13 = (ushort *)(uVar23 + (long)__src);
      }
      uVar6 = *puVar13;
      uVar23 = (ulong)uVar6;
      puVar13 = puVar13 + 1;
      pBVar15 = pBVar18 + -uVar23;
      uVar24 = (ulong)(bVar4 & 0xf);
      if (uVar24 == 0xf) {
        __src = puVar13;
        if (pBVar15 < dest) goto LAB_00111dd8;
        uVar9 = 0;
        puVar14 = puVar13;
        do {
          puVar13 = (ushort *)((long)puVar14 + 1);
          __src = puVar13;
          if (puVar1 + -2 <= puVar13) goto LAB_00111dd8;
          uVar8 = *puVar14;
          uVar9 = uVar9 + (byte)uVar8;
          puVar14 = puVar13;
        } while ((byte)uVar8 == 0xff);
        uVar20 = (ulong)uVar9;
        if ((BYTE *)(-uVar20 - 0x10) < pBVar18) goto LAB_00111dd8;
        uVar24 = uVar20 + 0x13;
        if (pBVar2 + -0x40 <= pBVar18 + uVar20 + 0x13) goto LAB_00111f7e;
LAB_00111d44:
        __src = puVar13;
        if (pBVar15 < dest) goto LAB_00111dd8;
        dstEnd = pBVar18 + uVar24;
        if (uVar6 < 0x10) {
          LZ4_memcpy_using_offset(pBVar18,pBVar15,dstEnd,uVar23);
        }
        else {
          do {
            uVar7 = *(undefined8 *)(pBVar18 + -uVar23 + 8);
            *(undefined8 *)pBVar18 = *(undefined8 *)(pBVar18 + -uVar23);
            *(undefined8 *)(pBVar18 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar18 + -uVar23 + 0x10 + 8);
            *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)(pBVar18 + -uVar23 + 0x10);
            *(undefined8 *)(pBVar18 + 0x18) = uVar7;
            pBVar18 = pBVar18 + 0x20;
          } while (pBVar18 < dstEnd);
        }
      }
      else {
        dstEnd = pBVar18 + uVar24 + 4;
        uVar24 = uVar24 + 4;
        if (pBVar2 + -0x40 <= dstEnd) goto LAB_00111f7e;
        if ((pBVar15 < dest) || (uVar6 < 8)) goto LAB_00111d44;
        *(undefined8 *)pBVar18 = *(undefined8 *)pBVar15;
        *(undefined8 *)(pBVar18 + 8) = *(undefined8 *)(pBVar15 + 8);
        *(undefined2 *)(pBVar18 + 0x10) = *(undefined2 *)(pBVar15 + 0x10);
      }
      goto LAB_00111bbe;
    }
  }
  return iVar21;
LAB_00111f7e:
  __src = puVar13;
  if (pBVar15 < dest) {
LAB_00111dd8:
    return ~(uint)__src + (int)source;
  }
  dstEnd = pBVar18 + uVar24;
  if ((uint)uVar23 < 8) {
    pBVar18[0] = '\0';
    pBVar18[1] = '\0';
    pBVar18[2] = '\0';
    pBVar18[3] = '\0';
    *pBVar18 = *pBVar15;
    pBVar18[1] = pBVar15[1];
    pBVar18[2] = pBVar15[2];
    pBVar18[3] = pBVar15[3];
    uVar23 = (ulong)((uint)uVar23 << 2);
    uVar20 = (ulong)*(uint *)((long)inc32table + uVar23);
    *(undefined4 *)(pBVar18 + 4) = *(undefined4 *)(pBVar15 + uVar20);
    pBVar15 = pBVar15 + (uVar20 - (long)*(int *)((long)dec64table + uVar23));
  }
  else {
    *(undefined8 *)pBVar18 = *(undefined8 *)pBVar15;
    pBVar15 = pBVar15 + 8;
  }
  pBVar10 = pBVar18 + 8;
  if (pBVar2 + -0xc < dstEnd) {
    if (pBVar2 + -5 < dstEnd) goto LAB_00111dd8;
    pBVar18 = pBVar2 + -7;
    pBVar16 = pBVar15;
    pBVar19 = pBVar10;
    if (pBVar10 < pBVar18) {
      do {
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
        pBVar19 = pBVar19 + 8;
        pBVar16 = pBVar16 + 8;
      } while (pBVar19 < pBVar18);
      pBVar15 = pBVar15 + ((long)pBVar18 - (long)pBVar10);
      pBVar10 = pBVar18;
    }
    for (; pBVar10 < dstEnd; pBVar10 = pBVar10 + 1) {
      BVar5 = *pBVar15;
      pBVar15 = pBVar15 + 1;
      *pBVar10 = BVar5;
    }
  }
  else {
    *(undefined8 *)pBVar10 = *(undefined8 *)pBVar15;
    if (0x10 < uVar24) {
      pBVar18 = pBVar18 + 0x10;
      do {
        pBVar15 = pBVar15 + 8;
        *(undefined8 *)pBVar18 = *(undefined8 *)pBVar15;
        pBVar18 = pBVar18 + 8;
      } while (pBVar18 < dstEnd);
    }
  }
LAB_00111e59:
  while( true ) {
    __src = (ushort *)((long)puVar13 + 1);
    bVar4 = (byte)*puVar13;
    uVar23 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + (long)maxDecompressedSize + -0x20 < dstEnd)) goto LAB_00111ecb;
    uVar7 = *(undefined8 *)((long)puVar13 + 9);
    *(undefined8 *)dstEnd = *(undefined8 *)__src;
    *(undefined8 *)(dstEnd + 8) = uVar7;
    pBVar18 = dstEnd + uVar23;
    uVar24 = (ulong)(bVar4 & 0xf);
    puVar13 = (ushort *)((long)__src + uVar23) + 1;
    uVar6 = *(ushort *)((long)__src + uVar23);
    uVar23 = (ulong)uVar6;
    pBVar15 = pBVar18 + -uVar23;
    if (((uVar24 == 0xf) || (uVar6 < 8)) || (pBVar15 < dest)) goto LAB_00111f20;
    *(undefined8 *)pBVar18 = *(undefined8 *)pBVar15;
    *(undefined8 *)(pBVar18 + 8) = *(undefined8 *)(pBVar15 + 8);
    *(undefined2 *)(pBVar18 + 0x10) = *(undefined2 *)(pBVar15 + 0x10);
    dstEnd = pBVar18 + uVar24 + 4;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00111dd8;
  puVar13 = puVar13 + 1;
  uVar9 = 0;
  do {
    uVar6 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar9 = uVar9 + (byte)uVar6;
    puVar13 = (ushort *)((long)puVar13 + 1);
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar23 = (ulong)uVar9 + 0xf;
  if ((CARRY8((ulong)dstEnd,uVar23)) || ((ulong)-(long)puVar13 < uVar23)) goto LAB_00111dd8;
LAB_00111ecb:
  pBVar18 = dstEnd + uVar23;
  uVar9 = (uint)bVar4;
LAB_00111ecf:
  puVar13 = (ushort *)((long)__src + uVar23);
  if ((pBVar2 + -0xc < pBVar18) || (puVar1 + -4 < puVar13)) {
    if ((puVar13 == puVar1) && (pBVar18 <= pBVar2)) {
      memmove(dstEnd,__src,uVar23);
      return ((int)dstEnd + (int)uVar23) - (int)dest;
    }
    goto LAB_00111dd8;
  }
  do {
    *(undefined8 *)dstEnd = *(undefined8 *)__src;
    dstEnd = dstEnd + 8;
    __src = __src + 4;
  } while (dstEnd < pBVar18);
  uVar23 = (ulong)*puVar13;
  puVar13 = puVar13 + 1;
  pBVar15 = pBVar18 + -uVar23;
  uVar24 = (ulong)(uVar9 & 0xf);
LAB_00111f20:
  if ((int)uVar24 == 0xf) {
    uVar9 = 0;
    do {
      uVar6 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar9 = uVar9 + (byte)uVar6;
    } while ((byte)uVar6 == 0xff && puVar13 < puVar1 + -2);
    uVar24 = (ulong)uVar9 + 0xf;
    __src = puVar13;
    if ((puVar1 + -2 <= puVar13) || (CARRY8((ulong)pBVar18,uVar24))) goto LAB_00111dd8;
  }
  uVar24 = uVar24 + 4;
  goto LAB_00111f7e;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}